

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::int_writer<char,fmt::v5::basic_format_specs<char>>::dec_writer::operator()
          (dec_writer *this,truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it)

{
  char *local_30;
  undefined1 uStack_28;
  undefined7 uStack_27;
  undefined1 uStack_20;
  undefined8 uStack_1f;
  
  internal::
  format_decimal<char,unsigned_int,fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,fmt::v5::internal::no_thousands_sep>
            (&local_30,*(internal **)this,*(undefined4 *)(this + 4));
  *(ulong *)((long)&(it->super_truncating_iterator_base<char_*>).limit_ + 1) =
       CONCAT17(uStack_20,uStack_27);
  *(undefined8 *)((long)&(it->super_truncating_iterator_base<char_*>).count_ + 1) = uStack_1f;
  (it->super_truncating_iterator_base<char_*>).out_ = local_30;
  (it->super_truncating_iterator_base<char_*>).limit_ = CONCAT71(uStack_27,uStack_28);
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_decimal<char_type>(it, abs_value, num_digits);
      }